

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetMnemonicWord(void *handle,void *mnemonic_handle,uint32_t index,char **mnemonic_word)

{
  long *plVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_48,"GetMnemonicList",&local_49);
  cfd::capi::CheckBuffer(mnemonic_handle,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (mnemonic_word == (char **)0x0) {
    local_48._0_8_ = "cfdcapi_key.cpp";
    local_48._8_4_ = 0x8c0;
    local_48._16_8_ = "CfdGetMnemonicWord";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"mnemonic_word is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_48,"Failed to parameter. mnemonic_word is null.",&local_49);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_48);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  plVar1 = *(long **)((long)mnemonic_handle + 0x10);
  if (plVar1 != (long *)0x0) {
    if ((ulong)index < (ulong)(plVar1[1] - *plVar1 >> 5)) {
      pcVar2 = cfd::capi::CreateString((string *)(*plVar1 + (ulong)index * 0x20));
      *mnemonic_word = pcVar2;
      return 0;
    }
  }
  local_48._0_8_ = "cfdcapi_key.cpp";
  local_48._8_4_ = 0x8c9;
  local_48._16_8_ = "CfdGetMnemonicWord";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"index is maximum over.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to parameter. index is maximum over.",&local_49);
  cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)local_48);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetMnemonicWord(
    void* handle, void* mnemonic_handle, uint32_t index,
    char** mnemonic_word) {
  try {
    cfd::Initialize();
    CheckBuffer(mnemonic_handle, kPrefixGetMnemonicWordList);
    if (mnemonic_word == nullptr) {
      warn(CFD_LOG_SOURCE, "mnemonic_word is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mnemonic_word is null.");
    }

    CfdCapiGetMnemonicWordList* buffer =
        static_cast<CfdCapiGetMnemonicWordList*>(mnemonic_handle);
    if ((buffer->wordlist == nullptr) || (index >= buffer->wordlist->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    *mnemonic_word = CreateString((*buffer->wordlist)[index]);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}